

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SnapPromiseCapabilityInfo *capabilityInfo;
  TTDVar pvVar3;
  
  capabilityInfo =
       (SnapPromiseCapabilityInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<80ul>(alloc);
  (*reader->_vptr_FileReader[3])(reader,3,1);
  NSSnapValues::ParsePromiseCapabilityInfo(capabilityInfo,false,reader,alloc);
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  *(uint32 *)&capabilityInfo[1].CapabilityId = uVar1;
  pvVar3 = (TTDVar)FileReader::ReadAddr(reader,ptrIdVal,true);
  capabilityInfo[1].PromiseVar = pvVar3;
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  *(uint32 *)&capabilityInfo[1].ResolveVar = uVar1;
  pvVar3 = (TTDVar)FileReader::ReadAddr(reader,ptrIdVal,true);
  capabilityInfo[1].RejectVar = pvVar3;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  *(char *)&capabilityInfo[2].CapabilityId = (char)iVar2;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  *(char *)((long)&capabilityInfo[2].CapabilityId + 1) = (char)iVar2;
  pvVar3 = (TTDVar)FileReader::ReadAddr(reader,ptrIdVal,true);
  capabilityInfo[2].PromiseVar = pvVar3;
  if (snpObject->SnapObjectTag == SnapPromiseAllSettledResolveOrRejectElementFunctionObject) {
    snpObject->AddtlSnapObjectInfo = capabilityInfo;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo = alloc.SlabAllocateStruct<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo>();

            reader->ReadKey(NSTokens::Key::entry, true);
            NSSnapValues::ParsePromiseCapabilityInfo(&aInfo->Capabilities, false, reader, alloc);

            aInfo->Index = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            aInfo->RemainingElementsWrapperId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            aInfo->RemainingElementsValue = reader->ReadUInt32(NSTokens::Key::u32Val, true);

            aInfo->AlreadyCalledWrapperId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            aInfo->AlreadyCalledValue = reader->ReadBool(NSTokens::Key::boolVal, true);

            aInfo->IsRejecting = reader->ReadBool(NSTokens::Key::boolVal, true);
            aInfo->Values = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);

            SnapObjectSetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(snpObject, aInfo);
        }